

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Primitive.cpp
# Opt level: O2

void __thiscall Primitive::Primitive(Primitive *this)

{
  int iVar1;
  
  this->_vptr_Primitive = (_func_int **)&PTR_getColor_0011f800;
  (this->color).x = 0.0;
  (this->color).y = 0.0;
  (this->color).z = 0.0;
  (this->absor).x = 0.0;
  (this->absor).y = 0.0;
  (this->absor).z = 0.0;
  Picture::Picture(&this->texture);
  iVar1 = rand();
  this->hashId = iVar1;
  this->refl = 0.0;
  this->refr = 0.0;
  this->rindex = 0.0;
  this->diff = 0.0;
  this->spec = 0.0;
  (this->color).x = 0.0;
  (this->color).y = 0.0;
  (this->color).z = 0.0;
  (this->absor).x = 0.0;
  (this->absor).y = 0.0;
  (this->absor).z = 0.0;
  iVar1 = cnt + 1;
  this->id = cnt;
  cnt = iVar1;
  return;
}

Assistant:

Primitive::Primitive() {
    hashId = rand();
    color = absor = Color();
    refl = refr = diff = spec = 0;
    rindex = 0;
    id = cnt++;
}